

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O1

bool __thiscall
ON_3dPointArray::Create
          (ON_3dPointArray *this,int point_dimension,int bRational,int point_count,int point_stride,
          float *points)

{
  double *pdVar1;
  float fVar2;
  float fVar3;
  ON_3dPoint *pOVar4;
  float *pfVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  ON_3dPoint q;
  ON_4dPoint h;
  ON_3dPoint local_68;
  ON_4dPoint local_50;
  
  bVar7 = (point_dimension & 0xfffffffeU) == 2;
  bVar8 = points != (float *)0x0;
  if (point_dimension != 0 || bRational <= point_stride && ((bVar8 && 0 < point_count) && bVar7)) {
    ON_3dPoint::ON_3dPoint(&local_68,0.0,0.0,0.0);
    ON_4dPoint::ON_4dPoint(&local_50,0.0,0.0,0.0,1.0);
    (this->super_ON_SimpleArray<ON_3dPoint>).m_count = 0;
    ON_SimpleArray<ON_3dPoint>::SetCapacity
              (&this->super_ON_SimpleArray<ON_3dPoint>,(long)point_count);
    if ((-1 < point_count) && (point_count <= (this->super_ON_SimpleArray<ON_3dPoint>).m_capacity))
    {
      (this->super_ON_SimpleArray<ON_3dPoint>).m_count = point_count;
    }
    if (bRational == 0) {
      if (0 < point_count) {
        pfVar5 = points + 2;
        lVar6 = 0;
        do {
          fVar2 = pfVar5[-2];
          fVar3 = pfVar5[-1];
          if (point_dimension == 3) {
            local_68.z = (double)*pfVar5;
          }
          pOVar4 = (this->super_ON_SimpleArray<ON_3dPoint>).m_a;
          *(double *)((long)&pOVar4->z + lVar6) = local_68.z;
          pdVar1 = (double *)((long)&pOVar4->x + lVar6);
          *pdVar1 = (double)fVar2;
          pdVar1[1] = (double)fVar3;
          lVar6 = lVar6 + 0x18;
          pfVar5 = pfVar5 + point_stride;
        } while ((ulong)(uint)point_count * 0x18 != lVar6);
      }
    }
    else if (0 < point_count) {
      lVar6 = 0;
      do {
        local_50.x = (double)*points;
        local_50.y = (double)points[1];
        if (point_dimension == 3) {
          local_50.z = (double)points[2];
        }
        local_50.w = (double)points[point_dimension];
        ON_3dPoint::operator=
                  ((ON_3dPoint *)((long)&((this->super_ON_SimpleArray<ON_3dPoint>).m_a)->x + lVar6),
                   &local_50);
        lVar6 = lVar6 + 0x18;
        points = points + point_stride;
      } while ((ulong)(uint)point_count * 0x18 != lVar6);
    }
  }
  else {
    ON_SimpleArray<ON_3dPoint>::SetCapacity(&this->super_ON_SimpleArray<ON_3dPoint>,0);
  }
  return point_dimension != 0 || bRational <= point_stride && ((bVar8 && 0 < point_count) && bVar7);
}

Assistant:

bool ON_3dPointArray::Create( 
  int point_dimension,
  int bRational,
  int point_count,
  int point_stride,
  const float* points
  )
{
  bool rc = false;
  if (     point_dimension >= 2 && point_dimension <= 3 
        && point_count>0 && points 
        && point_stride >= bRational?(point_dimension+1):point_dimension )
  {
    rc = true;
    int i;
    ON_3dPoint q(0.0,0.0,0.0);
    ON_4dPoint h(0.0,0.0,0.0,1.0);
    m_count = 0;
    SetCapacity(point_count);
    SetCount(point_count);
    if ( bRational )
    {
      for ( i = 0; i < point_count; i++ )
      {
        h.x = points[0];
        h.y = points[1];
        if ( point_dimension == 3 )
          h.z = points[2];
        h.w = points[point_dimension];
        m_a[i] = h;
        points += point_stride;
      }
    }
    else
    {
      for ( i = 0; i < point_count; i++ )
      {
        q.x = points[0];
        q.y = points[1];
        if ( point_dimension == 3 )
          q.z = points[2];
        m_a[i] = q;
        points += point_stride;
      }
    }
  }
  else
    Destroy();
  return rc;
}